

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::createLink
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  uint *puVar5;
  int *piVar6;
  long lVar7;
  char *b;
  long in_FS_OFFSET;
  NativePath local_68;
  NativePath local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QFileSystemEntry::isEmpty(source);
  if (bVar2) {
LAB_001326af:
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  else {
    QFileSystemEntry::nativeFilePath(&local_50,source);
    pcVar1 = local_50.d.ptr;
    if (local_50.d.size == 0) {
LAB_0013253e:
      lVar7 = -1;
    }
    else {
      pvVar4 = memchr(local_50.d.ptr,0,local_50.d.size);
      if (pvVar4 == (void *)0x0) goto LAB_0013253e;
      lVar7 = (long)pvVar4 - (long)pcVar1;
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (lVar7 != -1) goto LAB_001326af;
    bVar2 = QFileSystemEntry::isEmpty(target);
    if (bVar2) goto LAB_001326af;
    QFileSystemEntry::nativeFilePath(&local_50,target);
    pcVar1 = local_50.d.ptr;
    if (local_50.d.size == 0) {
LAB_001325b8:
      lVar7 = -1;
    }
    else {
      pvVar4 = memchr(local_50.d.ptr,0,local_50.d.size);
      if (pvVar4 == (void *)0x0) goto LAB_001325b8;
      lVar7 = (long)pvVar4 - (long)pcVar1;
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (lVar7 != -1) goto LAB_001326af;
    QFileSystemEntry::nativeFilePath(&local_50,source);
    if (local_50.d.ptr == (char *)0x0) {
      local_50.d.ptr = "";
    }
    QFileSystemEntry::nativeFilePath(&local_68,target);
    if (local_68.d.ptr == (char *)0x0) {
      local_68.d.ptr = "";
    }
    iVar3 = symlink(local_50.d.ptr,local_68.d.ptr);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar3 == 0) {
      bVar2 = true;
      goto LAB_00132690;
    }
    puVar5 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar5 | 0x100000000);
  }
  bVar2 = false;
LAB_00132690:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::createLink(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    Q_CHECK_FILE_NAME(source, false);
    Q_CHECK_FILE_NAME(target, false);

    if (::symlink(source.nativeFilePath().constData(), target.nativeFilePath().constData()) == 0)
        return true;
    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}